

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall cmsys::CommandLineArguments::GenerateHelp(CommandLineArguments *this)

{
  char *pcVar1;
  iterator iVar2;
  _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
  *p_Var3;
  _Base_ptr p_Var4;
  Internal *pIVar5;
  iterator __position;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  _Self __tmp;
  _Rb_tree_header *p_Var13;
  _Self __tmp_1;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  _Self __tmp_2;
  char *__s;
  _Self __tmp_4;
  char argument [100];
  MapArgs mp;
  char format [80];
  ostringstream str;
  char buffer [80];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  p_Var13 = &mp._M_t._M_impl.super__Rb_tree_header;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar5 = this->Internals;
  p_Var4 = *(_Base_ptr *)
            ((long)&(pIVar5->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
  while ((_Rb_tree_header *)p_Var4 !=
         &(pIVar5->Callbacks).
          super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
          ._M_t._M_impl.super__Rb_tree_header) {
    String::String((String *)argument,(value_type *)p_Var4[3]._M_left);
    iVar2 = std::
            _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
            ::find(&mp._M_t,(key_type *)argument);
    p_Var8 = p_Var4 + 1;
    std::__cxx11::string::~string((string *)argument);
    if ((_Rb_tree_header *)iVar2._M_node != p_Var13) {
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>
                ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)(iVar2._M_node + 2),(String *)p_Var8);
    }
    p_Var3 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
              *)std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                              *)&mp._M_t,(key_type *)p_Var8);
    std::
    _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
    ::_M_insert_unique<cmsys::String_const&>(p_Var3,(String *)p_Var8);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    pIVar5 = this->Internals;
  }
  p_Var4 = *(_Base_ptr *)
            ((long)&(pIVar5->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  while( true ) {
    p_Var13 = &mp._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 ==
        &(pIVar5->Callbacks).
         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ._M_t._M_impl.super__Rb_tree_header) break;
    String::String((String *)argument,(value_type *)p_Var4[3]._M_left);
    iVar2 = std::
            _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
            ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                    *)&mp,(key_type *)argument);
    p_Var8 = p_Var4 + 1;
    std::__cxx11::string::~string((string *)argument);
    if ((_Rb_tree_header *)iVar2._M_node == p_Var13) {
      p_Var3 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                *)std::
                  map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                  ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                *)&mp,(key_type *)p_Var8);
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>(p_Var3,(String *)p_Var8);
    }
    else {
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>
                ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)(iVar2._M_node + 2),(String *)p_Var8);
      __position = std::
                   _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                   ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                           *)&mp,(key_type *)p_Var8);
      for (p_Var6 = __position._M_node[2]._M_right;
          p_Var6 != (_Base_ptr)&__position._M_node[2]._M_parent;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar2._M_node + 2),(String *)(p_Var6 + 1));
      }
      std::
      _Rb_tree<cmsys::String,std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>,std::_Select1st<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
      ::erase_abi_cxx11_((_Rb_tree<cmsys::String,std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>,std::_Select1st<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
                          *)&mp,__position);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    pIVar5 = this->Internals;
  }
  p_Var4 = (_Base_ptr)0x0;
  for (p_Var6 = mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var13; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    for (p_Var8 = p_Var6[2]._M_right; p_Var8 != (_Rb_tree_node_base *)&p_Var6[2]._M_parent;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      p_Var9 = p_Var8[1]._M_parent;
      pmVar7 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var8 + 1));
      iVar17 = pmVar7->ArgumentType;
      if (iVar17 == 1) {
        p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 3);
      }
      else if ((iVar17 == 2) || (iVar17 == 3)) {
        p_Var9 = (_Base_ptr)&p_Var9->field_0x4;
      }
      if (p_Var4 < p_Var9) {
        p_Var4 = p_Var9;
      }
    }
  }
  sprintf(format,"  %%-%us  ",(ulong)p_Var4 & 0xffffffff);
  p_Var6 = mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &mp._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->Help,(string *)argument);
      std::__cxx11::string::~string((string *)argument);
      std::
      _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
      ::~_Rb_tree(&mp._M_t);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      return;
    }
    for (p_Var9 = p_Var6[2]._M_right; p_Var9 != (_Base_ptr)&p_Var6[2]._M_parent;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::endl<char,std::char_traits<char>>((ostream *)&str);
      strcpy(argument,*(char **)(p_Var9 + 1));
      pmVar7 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var9 + 1));
      switch(pmVar7->ArgumentType) {
      case 1:
        sVar10 = strlen(argument);
        builtin_strncpy(argument + sVar10,"opt",4);
        break;
      case 2:
        sVar10 = strlen(argument);
        builtin_strncpy(argument + sVar10," opt",4);
        goto LAB_0012c1ce;
      case 3:
        sVar10 = strlen(argument);
        builtin_strncpy(argument + sVar10,"=opt",4);
LAB_0012c1ce:
        argument[sVar10 + 4] = '\0';
        break;
      case 4:
        sVar10 = strlen(argument);
        builtin_strncpy(argument + sVar10," opt opt ...",0xd);
      }
      sprintf(buffer,format,argument);
      std::operator<<((ostream *)&str,buffer);
    }
    pmVar7 = std::
             map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
             ::operator[](&(this->Internals->Callbacks).
                           super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                          ,(key_type *)(p_Var6 + 1));
    __s = pmVar7->Help;
    sVar10 = strlen(__s);
    iVar17 = 0;
    for (; sVar10 != 0; sVar10 = sVar10 - uVar16) {
      for (lVar11 = 0; __s[lVar11] != '\0'; lVar11 = lVar11 + 1) {
        if ((*__s == ' ') || (*__s == '\t')) {
          __s = __s + 1;
          sVar10 = sVar10 - 1;
        }
      }
      puVar14 = &p_Var4->field_0x4;
      if (iVar17 != 0) {
        while (puVar14 != (undefined1 *)0x0) {
          std::operator<<((ostream *)&str," ");
          puVar14 = puVar14 + -1;
        }
      }
      uVar12 = (ulong)this->LineLength - (long)&p_Var4->field_0x4;
      uVar16 = sVar10;
      if (uVar12 < sVar10) {
        uVar15 = (ulong)this->LineLength + (-5 - (long)p_Var4);
        do {
          uVar16 = uVar12;
          if ((uVar15 == 0) || (pcVar1 = __s + uVar15, uVar16 = uVar15, *pcVar1 == ' ')) break;
          uVar15 = uVar15 - 1;
        } while (*pcVar1 != '\t');
      }
      std::ostream::write((char *)&str,(long)__s);
      std::endl<char,std::char_traits<char>>((ostream *)&str);
      __s = __s + uVar16;
      iVar17 = iVar17 + 1;
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void CommandLineArguments::GenerateHelp()
{
  std::ostringstream str;
  
  // Collapse all arguments into the map of vectors of all arguments that do
  // the same thing.
  CommandLineArguments::Internal::CallbacksMap::iterator it;
  typedef std::map<CommandLineArguments::Internal::String,
     CommandLineArguments::Internal::SetOfStrings > MapArgs;
  MapArgs mp;
  MapArgs::iterator mpit, smpit;
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      mp[it->first].insert(it->first);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      smpit = mp.find(it->first);
      CommandLineArguments::Internal::SetOfStrings::iterator sit;
      for ( sit = smpit->second.begin(); sit != smpit->second.end(); sit++ )
        {
        mpit->second.insert(*sit);
        }
      mp.erase(smpit);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
 
  // Find the length of the longest string
  CommandLineArguments::Internal::String::size_type maxlen = 0;
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      CommandLineArguments::Internal::String::size_type clen = sit->size();
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT:     clen += 0; break;
        case CommandLineArguments::CONCAT_ARGUMENT: clen += 3; break;
        case CommandLineArguments::SPACE_ARGUMENT:  clen += 4; break;
        case CommandLineArguments::EQUAL_ARGUMENT:  clen += 4; break;
        }
      if ( clen > maxlen )
        {
        maxlen = clen;
        }
      }
    }

  // Create format for that string
  char format[80];
  sprintf(format, "  %%-%us  ", static_cast<unsigned int>(maxlen));

  maxlen += 4; // For the space before and after the option

  // Print help for each option
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      str << std::endl;
      char argument[100];
      sprintf(argument, "%s", sit->c_str());
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT: break;
        case CommandLineArguments::CONCAT_ARGUMENT: strcat(argument, "opt"); break;
        case CommandLineArguments::SPACE_ARGUMENT:  strcat(argument, " opt"); break;
        case CommandLineArguments::EQUAL_ARGUMENT:  strcat(argument, "=opt"); break;
        case CommandLineArguments::MULTI_ARGUMENT:  strcat(argument, " opt opt ..."); break;
        }
      char buffer[80];
      sprintf(buffer, format, argument);
      str << buffer;
      }
    const char* ptr = this->Internals->Callbacks[mpit->first].Help;
    size_t len = strlen(ptr);
    int cnt = 0;
    while ( len > 0)
      {
      // If argument with help is longer than line length, split it on previous
      // space (or tab) and continue on the next line
      CommandLineArguments::Internal::String::size_type cc;
      for ( cc = 0; ptr[cc]; cc ++ )
        {
        if ( *ptr == ' ' || *ptr == '\t' )
          {
          ptr ++;
          len --;
          }
        }
      if ( cnt > 0 )
        {
        for ( cc = 0; cc < maxlen; cc ++ )
          {
          str << " ";
          }
        }
      CommandLineArguments::Internal::String::size_type skip = len;
      if ( skip > this->LineLength - maxlen )
        {
        skip = this->LineLength - maxlen;
        for ( cc = skip-1; cc > 0; cc -- )
          {
          if ( ptr[cc] == ' ' || ptr[cc] == '\t' )
            {
            break;
            }
          }
        if ( cc != 0 )
          {
          skip = cc;
          }
        }
      str.write(ptr, static_cast<std::streamsize>(skip));
      str << std::endl;
      ptr += skip;
      len -= skip;
      cnt ++;
      }
    }
  /*
  // This can help debugging help string
  str << endl;
  unsigned int cc;
  for ( cc = 0; cc < this->LineLength; cc ++ )
    {
    str << cc % 10;
    }
  str << endl;
  */
  this->Help = str.str();
}